

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

LY_ERR lyxml_parse_identifier(lyxml_ctx *xmlctx,char **start,char **end)

{
  uint uVar1;
  char *pcVar2;
  LY_ERR LVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint32_t c;
  char *in;
  size_t parsed;
  
  pcVar2 = xmlctx->in->current;
  in = pcVar2;
  LVar3 = ly_getutf8(&in,&c,&parsed);
  if (LVar3 == LY_SUCCESS) {
    uVar1 = (c & 0xffffffdf) - 0x41;
    if ((c != 0x5f && 0x19 < uVar1) && (c == 0x37e || 0x1c8f < c - 0x370)) {
      auVar7._0_4_ = -(uint)(-0x7ffffee1 < (int)(c - 0x2070 ^ 0x80000000));
      auVar7._4_4_ = -(uint)(-0x7ffffc11 < (int)(c - 0x2c00 ^ 0x80000000));
      auVar7._8_4_ = -(uint)(-0x7fff5802 < (int)(c - 0x3001 ^ 0x80000000));
      auVar7._12_4_ = -(uint)(-0x7ffffb31 < (int)(c - 0xf900 ^ 0x80000000));
      iVar4 = movmskps(CONCAT31((int3)(uVar1 >> 8),c != 0x37e),auVar7);
      if (((iVar4 == 0xf) &&
          (((0x20d < c - 0xfdf0 && (0xdffff < c - 0x10000)) && ((c & 0xfffffffe) != 0x200c)))) &&
         (0x23f < c - 0xc0 || (c & 0xffffffdf) == 0xd7)) {
        ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,
                "Identifier \"%s\" starts with an invalid character.",(long)in - parsed);
        goto LAB_001998b5;
      }
    }
    do {
      do {
        ly_in_skip(xmlctx->in,parsed);
        LVar3 = ly_getutf8(&in,&c,&parsed);
        if (LVar3 != LY_SUCCESS) goto LAB_00199896;
      } while ((((c - 0x61 < 0x1a) || (c == 0x2d)) ||
               ((c == 0x5f || ((c - 0x30 < 10 || c - 0x41 < 0x1a || (c == 0x2e)))))) ||
              ((c == 0xb7 || (c != 0x37e && c - 0x370 < 0x1c90))));
      auVar5._0_4_ = -(uint)(-0x7fff5802 < (int)(c - 0x3001 ^ 0x80000000));
      auVar5._4_4_ = -(uint)(-0x7ffffb31 < (int)(c - 0xf900 ^ 0x80000000));
      auVar5._8_4_ = -(uint)(-0x7ffffdf3 < (int)(c - 0xfdf0 ^ 0x80000000));
      auVar5._12_4_ = -(uint)(-0x7ff20001 < (int)(c - 0x10000 ^ 0x80000000));
      auVar6._0_4_ = -(uint)(-0x7fffff91 < (int)(c - 0x300 ^ 0x80000000));
      auVar6._4_4_ = -(uint)(-0x7ffffee1 < (int)(c - 0x2070 ^ 0x80000000));
      auVar6._8_4_ = -(uint)(-0x7fffffff < (int)(c - 0x203f ^ 0x80000000));
      auVar6._12_4_ = -(uint)(-0x7ffffc11 < (int)(c - 0x2c00 ^ 0x80000000));
      auVar7 = packssdw(auVar6,auVar5);
      auVar7 = packsswb(auVar7,auVar7);
    } while ((((byte)(SUB161(auVar7 >> 7,0) & 1 | (SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                      (SUB161(auVar7 >> 0x17,0) & 1) << 2 | (SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                      (SUB161(auVar7 >> 0x27,0) & 1) << 4 | (SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                      (SUB161(auVar7 >> 0x37,0) & 1) << 6 | SUB161(auVar7 >> 0x3f,0) << 7) != 0xff)
             || ((c & 0xfffffffe) == 0x200c)) || (c - 0xc0 < 0x240 && (c & 0xffffffdf) != 0xd7));
    *start = pcVar2;
    *end = xmlctx->in->current;
    LVar3 = LY_SUCCESS;
  }
  else {
LAB_00199896:
    ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",(ulong)(uint)(int)*in);
LAB_001998b5:
    LVar3 = LY_EVALID;
  }
  return LVar3;
}

Assistant:

static LY_ERR
lyxml_parse_identifier(struct lyxml_ctx *xmlctx, const char **start, const char **end)
{
    const char *s, *in;
    uint32_t c;
    size_t parsed;
    LY_ERR rc;

    in = s = xmlctx->in->current;

    /* check NameStartChar (minus colon) */
    LY_CHECK_ERR_RET(ly_getutf8(&in, &c, &parsed),
            LOGVAL(xmlctx->ctx, LY_VCODE_INCHAR, in[0]),
            LY_EVALID);
    LY_CHECK_ERR_RET(!is_xmlqnamestartchar(c),
            LOGVAL(xmlctx->ctx, LYVE_SYNTAX, "Identifier \"%s\" starts with an invalid character.", in - parsed),
            LY_EVALID);

    /* check rest of the identifier */
    do {
        /* move only successfully parsed bytes */
        ly_in_skip(xmlctx->in, parsed);

        rc = ly_getutf8(&in, &c, &parsed);
        LY_CHECK_ERR_RET(rc, LOGVAL(xmlctx->ctx, LY_VCODE_INCHAR, in[0]), LY_EVALID);
    } while (is_xmlqnamechar(c));

    *start = s;
    *end = xmlctx->in->current;
    return LY_SUCCESS;
}